

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

string * __thiscall
iutest::PrintToStrings<int,int>
          (string *__return_storage_ptr__,iutest *this,char *separate,int *v,int args)

{
  string local_58;
  undefined1 local_25;
  int local_24;
  char *pcStack_20;
  int args_local;
  int *v_local;
  char *separate_local;
  string *str;
  
  local_24 = (int)v;
  local_25 = 0;
  pcStack_20 = separate;
  v_local = (int *)this;
  separate_local = (char *)__return_storage_ptr__;
  PrintToString<int>(__return_storage_ptr__,(int *)separate);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)v_local);
  PrintToStrings<int>(&local_58,(char *)v_local,&local_24);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string PrintToStrings(const char* separate, const T& v, Args... args)
{
    ::std::string str = PrintToString(v);
    str += separate;
    str += PrintToStrings(separate, args...);
    return str;
}